

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageFieldNoLabel
          (Parser *this,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *field_location,FileDescriptorProto *containing_file)

{
  char cVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  string *psVar5;
  long *plVar6;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *message
  ;
  ulong uVar7;
  Arena *pAVar8;
  ArenaStringPtr *this_00;
  long lVar9;
  RepeatedField<int> *this_01;
  string_view text;
  string_view text_00;
  ErrorMaker error;
  ErrorMaker error_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  LocationRecorder location;
  Type type;
  RepeatedPtrFieldBase *local_c0;
  Token name_token;
  MapField map_field;
  
  map_field.key_type_name._M_dataplus._M_p = (pointer)&map_field.key_type_name.field_2;
  map_field.is_map_field = false;
  map_field.key_type_name._M_string_length = 0;
  map_field.key_type_name.field_2._M_local_buf[0] = '\0';
  map_field.value_type_name._M_dataplus._M_p = (pointer)&map_field.value_type_name.field_2;
  map_field.value_type_name._M_string_length = 0;
  map_field.value_type_name.field_2._M_local_buf[0] = '\0';
  local_c0 = &messages->super_RepeatedPtrFieldBase;
  LocationRecorder::LocationRecorder(&location,field_location);
  LocationRecorder::RecordLegacyLocation(&location,&field->super_Message,TYPE);
  type = FieldDescriptorProto_Type_TYPE_INT32;
  name_token._0_8_ = &name_token.text._M_string_length;
  name_token.text._M_dataplus._M_p = (pointer)0x0;
  name_token.text._M_string_length._0_1_ = 0;
  text._M_str = "map";
  text._M_len = 3;
  bVar3 = TryConsume(this,text);
  if (bVar3) {
    text_00._M_str = "<";
    text_00._M_len = 1;
    bVar3 = LookingAt(this,text_00);
    if (!bVar3) {
      bVar3 = true;
      std::__cxx11::string::assign((char *)&name_token);
      goto LAB_001ad465;
    }
    map_field.is_map_field = true;
    bVar3 = ParseMapType(this,&map_field,field,&location);
    if (bVar3) goto LAB_001ad44e;
LAB_001ad506:
    std::__cxx11::string::~string((string *)&name_token);
    LocationRecorder::~LocationRecorder(&location);
    bVar3 = false;
    goto LAB_001ad8d2;
  }
LAB_001ad44e:
  bVar3 = false;
LAB_001ad465:
  if (map_field.is_map_field == false) {
    if (((undefined1  [80])((undefined1  [80])field->field_0 & (undefined1  [80])0x200) ==
         (undefined1  [80])0x0) && (bVar4 = DefaultToOptionalFields(this), bVar4)) {
      FieldDescriptorProto::set_label(field,FieldDescriptorProto_Label_LABEL_OPTIONAL);
    }
    if ((undefined1  [80])((undefined1  [80])field->field_0 & (undefined1  [80])0x200) ==
        (undefined1  [80])0x0) {
      RecordError(this,(ErrorMaker)ZEXT816(0x2fb257));
      FieldDescriptorProto::set_label(field,FieldDescriptorProto_Label_LABEL_OPTIONAL);
    }
    if ((!bVar3) && (bVar3 = ParseType(this,&type,(string *)&name_token), !bVar3))
    goto LAB_001ad506;
    this_01 = &((location.location_)->field_0)._impl_.path_;
    if (name_token.text._M_dataplus._M_p == (pointer)0x0) {
      RepeatedField<int>::Add(this_01,5);
      FieldDescriptorProto::set_type(field,type);
    }
    else {
      RepeatedField<int>::Add(this_01,6);
      *(byte *)&field->field_0 = *(byte *)&field->field_0 | 4;
      pAVar8 = (Arena *)(field->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(field->field_0)._impl_.type_name_,(string *)&name_token,pAVar8);
    }
  }
  std::__cxx11::string::~string((string *)&name_token);
  LocationRecorder::~LocationRecorder(&location);
  io::Tokenizer::Token::Token(&name_token,&this->input_->current_);
  LocationRecorder::LocationRecorder(&location,field_location,1);
  LocationRecorder::RecordLegacyLocation(&location,&field->super_Message,NAME);
  psVar5 = FieldDescriptorProto::_internal_mutable_name_abi_cxx11_(field);
  bVar3 = ConsumeIdentifier(this,psVar5,(ErrorMaker)ZEXT816(0x2fb287));
  if (bVar3) {
    plVar6 = (long *)((ulong)(field->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    lVar9 = 0;
    do {
      if (plVar6[1] == lVar9) goto LAB_001ad5f2;
      cVar1 = *(char *)(*plVar6 + lVar9);
      lVar9 = lVar9 + 1;
    } while ((((byte)(cVar1 - 0x30U) < 10) || (cVar1 == '_')) || ((byte)(cVar1 + 0x9fU) < 0x1a));
    error.func_ = ErrorMaker::
                  ErrorMaker<google::protobuf::compiler::Parser::ParseMessageFieldNoLabel(google::protobuf::FieldDescriptorProto*,google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>*,google::protobuf::compiler::Parser::LocationRecorder_const&,int,google::protobuf::compiler::Parser::LocationRecorder_const&,google::protobuf::FileDescriptorProto_const*)::$_0,void>(google::protobuf::compiler::Parser::ParseMessageFieldNoLabel(google::protobuf::FieldDescriptorProto*,google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>*,google::protobuf::compiler::Parser::LocationRecorder_const&,int,google::protobuf::compiler::Parser::LocationRecorder_const&,google::protobuf::FileDescriptorProto_const*)::$_0)
                  ::{lambda(void_const*)#1}::__invoke_abi_cxx11_;
    error.field_0.error_ = (char *)field;
    RecordWarning(this,error);
    plVar6 = (long *)((ulong)(field->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
LAB_001ad5f2:
    for (uVar7 = 1; uVar7 < (ulong)plVar6[1]; uVar7 = uVar7 + 1) {
      if (((byte)(*(char *)(*plVar6 + uVar7) - 0x30U) < 10) &&
         (*(char *)(*plVar6 + -1 + uVar7) == '_')) {
        error_00.func_ =
             ErrorMaker::
             ErrorMaker<google::protobuf::compiler::Parser::ParseMessageFieldNoLabel(google::protobuf::FieldDescriptorProto*,google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>*,google::protobuf::compiler::Parser::LocationRecorder_const&,int,google::protobuf::compiler::Parser::LocationRecorder_const&,google::protobuf::FileDescriptorProto_const*)::$_1,void>(google::protobuf::compiler::Parser::ParseMessageFieldNoLabel(google::protobuf::FieldDescriptorProto*,google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>*,google::protobuf::compiler::Parser::LocationRecorder_const&,int,google::protobuf::compiler::Parser::LocationRecorder_const&,google::protobuf::FileDescriptorProto_const*)::$_1)
             ::{lambda(void_const*)#1}::__invoke_abi_cxx11_;
        error_00.field_0.error_ = (char *)field;
        RecordWarning(this,error_00);
        break;
      }
    }
    LocationRecorder::~LocationRecorder(&location);
    text_01._M_str = "=";
    text_01._M_len = 1;
    bVar3 = Consume(this,text_01,(ErrorMaker)ZEXT816(0x2fb29c));
    if (!bVar3) goto LAB_001ad8c6;
    LocationRecorder::LocationRecorder(&location,field_location,3);
    LocationRecorder::RecordLegacyLocation(&location,&field->super_Message,NUMBER);
    bVar3 = ConsumeInteger(this,(int *)&type,(ErrorMaker)ZEXT816(0x2fb2b2));
    if (!bVar3) goto LAB_001ad8bc;
    (field->field_0)._impl_.number_ = type;
    *(byte *)&field->field_0 = *(byte *)&field->field_0 | 0x40;
    LocationRecorder::~LocationRecorder(&location);
    bVar3 = ParseFieldOptions(this,field,field_location,containing_file);
    if (!bVar3) goto LAB_001ad8c6;
    if (((undefined1  [80])((undefined1  [80])field->field_0 & (undefined1  [80])0x400) ==
         (undefined1  [80])0x0) || ((field->field_0)._impl_.type_ != 10)) {
      text_03._M_str = ";";
      text_03._M_len = 1;
      bVar3 = ConsumeEndOfDeclaration(this,text_03,field_location);
    }
    else {
      LocationRecorder::LocationRecorder(&location,parent_location);
      LocationRecorder::StartAt(&location,field_location);
      RepeatedField<int>::Add
                (&((location.location_)->field_0)._impl_.path_,location_field_number_for_nested_type
                );
      RepeatedField<int>::Add(&((location.location_)->field_0)._impl_.path_,local_c0->current_size_)
      ;
      message = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                          (local_c0);
      pvVar2 = (field->field_0)._impl_.name_.tagged_ptr_.ptr_;
      (message->field_0)._impl_._has_bits_.has_bits_[0] =
           (message->field_0)._impl_._has_bits_.has_bits_[0] | 1;
      this_00 = &(message->field_0)._impl_.name_;
      pAVar8 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>(this_00,(string *)((ulong)pvVar2 & 0xfffffffffffffffc),pAVar8)
      ;
      LocationRecorder::LocationRecorder((LocationRecorder *)&type,&location,1);
      LocationRecorder::StartAt((LocationRecorder *)&type,&name_token);
      LocationRecorder::EndAt((LocationRecorder *)&type,&name_token);
      LocationRecorder::RecordLegacyLocation((LocationRecorder *)&type,&message->super_Message,NAME)
      ;
      LocationRecorder::~LocationRecorder((LocationRecorder *)&type);
      LocationRecorder::LocationRecorder((LocationRecorder *)&type,field_location,6);
      LocationRecorder::StartAt((LocationRecorder *)&type,&name_token);
      LocationRecorder::EndAt((LocationRecorder *)&type,&name_token);
      LocationRecorder::~LocationRecorder((LocationRecorder *)&type);
      if ((byte)(**(char **)((ulong)(this_00->tagged_ptr_).ptr_ & 0xfffffffffffffffc) + 0xa5U) <
          0xe6) {
        RecordError(this,name_token.line,name_token.column,(ErrorMaker)ZEXT816(0x2fb2c9));
      }
      psVar5 = FieldDescriptorProto::_internal_mutable_name_abi_cxx11_(field);
      absl::lts_20240722::AsciiStrToLower((string *)psVar5);
      pvVar2 = (this_00->tagged_ptr_).ptr_;
      (field->field_0)._impl_._has_bits_.has_bits_[0] =
           (field->field_0)._impl_._has_bits_.has_bits_[0] | 4;
      pAVar8 = (Arena *)(field->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar8 & 1) != 0) {
        pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(field->field_0)._impl_.type_name_,(string *)((ulong)pvVar2 & 0xfffffffffffffffc),
                 pAVar8);
      text_02._M_str = "{";
      text_02._M_len = 1;
      bVar3 = LookingAt(this,text_02);
      if (!bVar3) {
        RecordError(this,(ErrorMaker)ZEXT816(0x2fb2f7));
        goto LAB_001ad8bc;
      }
      bVar3 = ParseMessageBlock(this,message,&location,containing_file);
      this = (Parser *)&location;
      LocationRecorder::~LocationRecorder((LocationRecorder *)this);
    }
    if (!bVar3) goto LAB_001ad8c6;
    bVar3 = true;
    if (map_field.is_map_field == true) {
      GenerateMapEntry(this,&map_field,field,
                       (RepeatedPtrField<google::protobuf::DescriptorProto> *)local_c0);
    }
  }
  else {
LAB_001ad8bc:
    LocationRecorder::~LocationRecorder(&location);
LAB_001ad8c6:
    bVar3 = false;
  }
  std::__cxx11::string::~string((string *)&name_token.text);
LAB_001ad8d2:
  MapField::~MapField(&map_field);
  return bVar3;
}

Assistant:

bool Parser::ParseMessageFieldNoLabel(
    FieldDescriptorProto* field, RepeatedPtrField<DescriptorProto>* messages,
    const LocationRecorder& parent_location,
    int location_field_number_for_nested_type,
    const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  MapField map_field;
  // Parse type.
  {
    LocationRecorder location(field_location);  // add path later
    location.RecordLegacyLocation(field, DescriptorPool::ErrorCollector::TYPE);

    bool type_parsed = false;
    FieldDescriptorProto::Type type = FieldDescriptorProto::TYPE_INT32;
    std::string type_name;

    // Special case map field. We only treat the field as a map field if the
    // field type name starts with the word "map" with a following "<".
    if (TryConsume("map")) {
      if (LookingAt("<")) {
        map_field.is_map_field = true;
        DO(ParseMapType(&map_field, field, location));
      } else {
        // False positive
        type_parsed = true;
        type_name = "map";
      }
    }
    if (!map_field.is_map_field) {
      // Handle the case where no explicit label is given for a non-map field.
      if (!field->has_label() && DefaultToOptionalFields()) {
        field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
      }
      if (!field->has_label()) {
        RecordError("Expected \"required\", \"optional\", or \"repeated\".");
        // We can actually reasonably recover here by just assuming the user
        // forgot the label altogether.
        field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
      }

      // Handle the case where the actual type is a message or enum named
      // "map", which we already consumed in the code above.
      if (!type_parsed) {
        DO(ParseType(&type, &type_name));
      }
      if (type_name.empty()) {
        location.AddPath(FieldDescriptorProto::kTypeFieldNumber);
        field->set_type(type);
      } else {
        location.AddPath(FieldDescriptorProto::kTypeNameFieldNumber);
        field->set_type_name(type_name);
      }
    }
  }

  // Parse name and '='.
  io::Tokenizer::Token name_token = input_->current();
  {
    LocationRecorder location(field_location,
                              FieldDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(field, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(field->mutable_name(), "Expected field name."));

    if (!IsLowerUnderscore(field->name())) {
      RecordWarning([=] {
        return absl::StrCat(
            "Field name should be lowercase. Found: ", field->name(),
            ". See: https://developers.google.com/protocol-buffers/docs/style");
      });
    }
    if (IsNumberFollowUnderscore(field->name())) {
      RecordWarning([=] {
        return absl::StrCat(
            "Number should not come right after an underscore. Found: ",
            field->name(),
            ". See: https://developers.google.com/protocol-buffers/docs/style");
      });
    }
  }
  DO(Consume("=", "Missing field number."));

  // Parse field number.
  {
    LocationRecorder location(field_location,
                              FieldDescriptorProto::kNumberFieldNumber);
    location.RecordLegacyLocation(field,
                                  DescriptorPool::ErrorCollector::NUMBER);
    int number;
    DO(ConsumeInteger(&number, "Expected field number."));
    field->set_number(number);
  }

  // Parse options.
  DO(ParseFieldOptions(field, field_location, containing_file));

  // Deal with groups.
  if (field->has_type() && field->type() == FieldDescriptorProto::TYPE_GROUP) {
    // Awkward:  Since a group declares both a message type and a field, we
    //   have to create overlapping locations.
    LocationRecorder group_location(parent_location);
    group_location.StartAt(field_location);
    group_location.AddPath(location_field_number_for_nested_type);
    group_location.AddPath(messages->size());

    DescriptorProto* group = messages->Add();
    group->set_name(field->name());

    // Record name location to match the field name's location.
    {
      LocationRecorder location(group_location,
                                DescriptorProto::kNameFieldNumber);
      location.StartAt(name_token);
      location.EndAt(name_token);
      location.RecordLegacyLocation(group,
                                    DescriptorPool::ErrorCollector::NAME);
    }

    // The field's type_name also comes from the name.  Confusing!
    {
      LocationRecorder location(field_location,
                                FieldDescriptorProto::kTypeNameFieldNumber);
      location.StartAt(name_token);
      location.EndAt(name_token);
    }

    // As a hack for backwards-compatibility, we force the group name to start
    // with a capital letter and lower-case the field name.  New code should
    // not use groups; it should use nested messages.
    if (group->name()[0] < 'A' || 'Z' < group->name()[0]) {
      RecordError(name_token.line, name_token.column,
                  "Group names must start with a capital letter.");
    }
    absl::AsciiStrToLower(field->mutable_name());

    field->set_type_name(group->name());
    if (LookingAt("{")) {
      DO(ParseMessageBlock(group, group_location, containing_file));
    } else {
      RecordError("Missing group body.");
      return false;
    }
  } else {
    DO(ConsumeEndOfDeclaration(";", &field_location));
  }

  // Create a map entry type if this is a map field.
  if (map_field.is_map_field) {
    GenerateMapEntry(map_field, field, messages);
  }

  return true;
}